

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O3

int __thiscall
CVmObjLookupTable::getp_get_def_val
          (CVmObjLookupTable *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  char *pcVar1;
  anon_union_8_8_cb74652f_for_val aVar2;
  int iVar3;
  
  if (getp_get_def_val(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_get_def_val();
  }
  iVar3 = CVmObject::get_prop_check_argc(retval,argc,&getp_get_def_val::desc);
  if (iVar3 == 0) {
    pcVar1 = (this->super_CVmObjCollection).super_CVmObject.ext_;
    aVar2 = *(anon_union_8_8_cb74652f_for_val *)(pcVar1 + 0x18);
    *(undefined8 *)retval = *(undefined8 *)(pcVar1 + 0x10);
    retval->val = aVar2;
  }
  return 1;
}

Assistant:

int CVmObjLookupTable::getp_get_def_val(VMG_ vm_obj_id_t self,
                                        vm_val_t *retval, uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* return the default value */
    *retval = get_ext()->default_value;
    return TRUE;
}